

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Projection.cpp
# Opt level: O2

void __thiscall
Projection::putDown(Projection *this,
                   Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *phi,
                   FArrayBox *phi_fine_strip,int c_lev,int f_lev,Orientation *outFaces,
                   int numOutFlowFaces,int ncStripWidth)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  pointer pIVar5;
  undefined8 uVar6;
  FabArray<amrex::FArrayBox> *this_00;
  ulong uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int i;
  uint uVar14;
  long lVar15;
  long lVar16;
  Periodicity *period;
  BATType BVar17;
  long lVar18;
  long lVar19;
  uint uVar20;
  ulong uVar21;
  int iVar22;
  undefined8 *puVar23;
  long lVar24;
  uint uVar25;
  long lVar26;
  undefined8 *puVar27;
  long lVar28;
  long lVar29;
  undefined8 *puVar30;
  int j;
  int iVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  IntVect IVar36;
  int local_3cc;
  int local_3c0;
  uint local_3bc;
  Box result;
  int local_398;
  int local_394;
  int local_390;
  Box local_36c;
  Box *local_350;
  ulong local_348;
  long local_340;
  long local_338;
  double *local_330;
  int local_324 [3];
  Box bx;
  MFIter mfi;
  DistributionMapping dm;
  BoxArray ba;
  MultiFab phi_crse_strip;
  
  if (numOutFlowFaces < 1) {
    numOutFlowFaces = 0;
  }
  lVar33 = (long)f_lev;
  local_3cc = 1;
  iVar22 = 1;
  local_3c0 = local_3cc;
  do {
    if (lVar33 <= c_lev) {
      return;
    }
    lVar33 = lVar33 + -1;
    pIVar5 = (this->parent->super_AmrCore).super_AmrMesh.super_AmrInfo.ref_ratio.
             super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
             super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar6 = *(undefined8 *)pIVar5[lVar33].vect;
    local_3cc = local_3cc * (int)uVar6;
    local_3c0 = local_3c0 * *(int *)((long)(pIVar5 + lVar33) + 8);
    local_324[0] = local_3cc;
    iVar22 = iVar22 * (int)((ulong)uVar6 >> 0x20);
    local_324[1] = iVar22;
    local_324[2] = local_3c0;
    local_340 = (long)iVar22 << 3;
    local_350 = (Box *)((long)((this->parent->super_AmrCore).super_AmrMesh.geom.
                               super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                               super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar33) + 0xac);
    for (local_348 = 0; local_348 != (uint)numOutFlowFaces; local_348 = local_348 + 1) {
      uVar7 = (long)outFaces[local_348].val % 3;
      uVar21 = uVar7 & 0xffffffff;
      ba.m_bat.m_op.m_bndryReg.m_typ.itype = (IndexType)(IndexType)(local_350->smallend).vect[2];
      ba.m_bat._0_8_ = *(undefined8 *)(local_350->smallend).vect;
      mfi.fabArray = (FabArrayBase *)CONCAT44(mfi.fabArray._4_4_,(local_350->bigend).vect[2]);
      mfi.m_fa._M_t.
      super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
      super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
      super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
           (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
            )(__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)
             *(__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_> *)
              (local_350->bigend).vect;
      uVar20 = (uint)uVar7;
      if (outFaces[local_348].val < 3) {
        BVar17 = (&ba.m_bat.m_bat_type)[(int)uVar20];
        mfi.tile_size.vect[(long)(int)uVar20 + -4] = BVar17;
        (&ba.m_bat.m_bat_type)[(int)uVar20] = (BVar17 - ncStripWidth) + indexType;
      }
      else {
        IVar36 = amrex::Box::type(local_350);
        result.smallend.vect[0] = IVar36.vect[0];
        result.smallend.vect[1] = IVar36.vect[1];
        result.smallend.vect[2] = IVar36.vect[2];
        BVar17 = (~result.smallend.vect[uVar21] & 1U) + mfi.tile_size.vect[uVar21 - 4];
        (&ba.m_bat.m_bat_type)[uVar21] = BVar17;
        mfi.tile_size.vect[uVar21 - 4] = BVar17 + ncStripWidth + -1;
      }
      bx.btype.itype = (local_350->btype).itype | 1 << (uVar20 & 0x1f);
      phi_crse_strip.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_bat_type =
           (BATType)ba.m_bat.m_op.m_bndryReg.m_typ.itype;
      phi_crse_strip.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase =
           (_func_int **)ba.m_bat._0_8_;
      phi_crse_strip.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
      m_bndryReg.m_crse_ratio.vect[0] = (int)mfi.fabArray;
      phi_crse_strip.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
      m_indexType.m_typ.itype =
           mfi.m_fa._M_t.
           super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>.
           _M_t.
           super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
           super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._0_4_;
      phi_crse_strip.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
      m_bndryReg.m_typ.itype =
           mfi.m_fa._M_t.
           super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>.
           _M_t.
           super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
           super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl._4_4_;
      bx.smallend.vect._0_8_ = ba.m_bat._0_8_;
      bx.smallend.vect[2] = (int)ba.m_bat.m_op.m_bndryReg.m_typ.itype;
      bx.bigend.vect[0] =
           (int)phi_crse_strip.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.
                m_op.m_indexType.m_typ.itype;
      bx.bigend.vect[1] =
           phi_crse_strip.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
           _4_4_;
      bx.bigend.vect[2] = (int)mfi.fabArray;
      for (lVar15 = 0; lVar15 != 3; lVar15 = lVar15 + 1) {
        if ((bx.btype.itype >> ((uint)lVar15 & 0x1f) & 1) == 0) {
          piVar1 = bx.bigend.vect + lVar15;
          *piVar1 = *piVar1 + 1;
        }
      }
      bx.btype.itype = 7;
      amrex::BoxArray::BoxArray(&ba,&bx);
      amrex::BoxArray::maxSize(&ba,0x20);
      amrex::DistributionMapping::DistributionMapping
                (&dm,&ba,*(int *)(amrex::ParallelContext::frames + 0x10));
      mfi.m_fa._M_t.
      super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
      super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
      super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl =
           (__uniq_ptr_data<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>,_true,_true>
            )(__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
      mfi.tile_size.vect[2] = 0;
      mfi.flags = '\0';
      mfi._29_3_ = 0;
      mfi.currentIndex = 0;
      mfi.beginIndex = 0;
      mfi.fabArray = (FabArrayBase *)0x0;
      mfi.tile_size.vect[0] = 0;
      mfi.tile_size.vect[1] = 0;
      result.smallend.vect[0] = 0x7d2928;
      result.smallend.vect[1] = 0;
      amrex::MultiFab::MultiFab
                ((MultiFab *)&phi_crse_strip.super_FabArray<amrex::FArrayBox>,&ba,&dm,1,0,
                 (MFInfo *)&mfi,(FabFactory<amrex::FArrayBox> *)&result);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&mfi.tile_size);
      amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                (&phi_crse_strip.super_FabArray<amrex::FArrayBox>,0.0);
      uVar7 = local_348;
      local_330 = phi_fine_strip[local_348].super_BaseFab<double>.dptr;
      iVar2 = phi_fine_strip[local_348].super_BaseFab<double>.domain.smallend.vect[0];
      iVar3 = phi_fine_strip[local_348].super_BaseFab<double>.domain.smallend.vect[1];
      local_338 = (long)phi_fine_strip[local_348].super_BaseFab<double>.domain.smallend.vect[2];
      iVar4 = phi_fine_strip[local_348].super_BaseFab<double>.domain.bigend.vect[0];
      iVar31 = phi_fine_strip[local_348].super_BaseFab<double>.domain.bigend.vect[1];
      amrex::MFIter::MFIter
                (&mfi,&phi_crse_strip.super_FabArray<amrex::FArrayBox>.super_FabArrayBase,'\0');
      lVar15 = (long)((iVar4 - iVar2) + 1);
      lVar18 = (long)((iVar31 - iVar3) + 1);
      local_330 = local_330 + -(long)iVar2;
      local_338 = -local_338;
      lVar35 = local_340 * lVar15;
      while (mfi.currentIndex < mfi.endIndex) {
        lVar29 = *(long *)phi_fine_strip[uVar7].super_BaseFab<double>.domain.smallend.vect;
        lVar16 = *(long *)(phi_fine_strip[uVar7].super_BaseFab<double>.domain.smallend.vect + 2);
        lVar24 = *(long *)phi_fine_strip[uVar7].super_BaseFab<double>.domain.bigend.vect;
        uVar6 = *(undefined8 *)(phi_fine_strip[uVar7].super_BaseFab<double>.domain.bigend.vect + 2);
        result.bigend.vect[1] = (int)((ulong)lVar24 >> 0x20);
        result.bigend.vect[2] = (int)uVar6;
        result.btype.itype = (uint)((ulong)uVar6 >> 0x20);
        result.smallend.vect[0] = (int)lVar29;
        result.smallend.vect[1] = (int)((ulong)lVar29 >> 0x20);
        result.smallend.vect[2] = (int)lVar16;
        result.bigend.vect[0] = (int)((ulong)lVar16 >> 0x20);
        if (iVar22 == 1 && local_3cc == 1) {
          if (local_3c0 != 1) goto LAB_0034d705;
          local_3bc = result.btype.itype;
        }
        else {
          if (local_3cc != 1) {
            if (local_3cc == 4) {
              if (result.smallend.vect[0] < 0) {
                result.smallend.vect[0] = result.smallend.vect[0] >> 2;
              }
              else {
                result.smallend.vect[0] = (uint)result.smallend.vect[0] >> 2;
              }
            }
            else if (local_3cc == 2) {
              if (result.smallend.vect[0] < 0) {
                result.smallend.vect[0] = result.smallend.vect[0] >> 1;
              }
              else {
                result.smallend.vect[0] = (uint)result.smallend.vect[0] >> 1;
              }
            }
            else if (result.smallend.vect[0] < 0) {
              result.smallend.vect[0] = ~(~result.smallend.vect[0] / local_3cc);
            }
            else {
              result.smallend.vect[0] = result.smallend.vect[0] / local_3cc;
            }
          }
          if (iVar22 != 1) {
            if (iVar22 == 4) {
              if (lVar29 < 0) {
                result.smallend.vect[1] = result.smallend.vect[1] >> 2;
              }
              else {
                result.smallend.vect[1] = (uint)result.smallend.vect[1] >> 2;
              }
            }
            else if (iVar22 == 2) {
              if (lVar29 < 0) {
                result.smallend.vect[1] = result.smallend.vect[1] >> 1;
              }
              else {
                result.smallend.vect[1] = (uint)result.smallend.vect[1] >> 1;
              }
            }
            else if (lVar29 < 0) {
              result.smallend.vect[1] = ~(~result.smallend.vect[1] / iVar22);
            }
            else {
              result.smallend.vect[1] = result.smallend.vect[1] / iVar22;
            }
          }
LAB_0034d705:
          if (local_3c0 != 1) {
            if (local_3c0 == 4) {
              if (result.smallend.vect[2] < 0) {
                result.smallend.vect[2] = result.smallend.vect[2] >> 2;
              }
              else {
                result.smallend.vect[2] = (uint)result.smallend.vect[2] >> 2;
              }
            }
            else if (local_3c0 == 2) {
              if (result.smallend.vect[2] < 0) {
                result.smallend.vect[2] = result.smallend.vect[2] >> 1;
              }
              else {
                result.smallend.vect[2] = (uint)result.smallend.vect[2] >> 1;
              }
            }
            else if (result.smallend.vect[2] < 0) {
              result.smallend.vect[2] = ~(~result.smallend.vect[2] / local_3c0);
            }
            else {
              result.smallend.vect[2] = result.smallend.vect[2] / local_3c0;
            }
          }
          if (result.btype.itype == 0) {
            uVar20 = result.bigend.vect[0];
            if (local_3cc != 1) {
              if (local_3cc == 4) {
                uVar20 = result.bigend.vect[0] >> 2;
                if (-1 < lVar16) {
                  uVar20 = (uint)result.bigend.vect[0] >> 2;
                }
              }
              else if (local_3cc == 2) {
                uVar20 = result.bigend.vect[0] >> 1;
                if (-1 < lVar16) {
                  uVar20 = (uint)result.bigend.vect[0] >> 1;
                }
              }
              else if (lVar16 < 0) {
                uVar20 = ~(~result.bigend.vect[0] / local_3cc);
              }
              else {
                uVar20 = result.bigend.vect[0] / local_3cc;
              }
            }
            uVar25 = result.bigend.vect[1];
            if (iVar22 != 1) {
              if (iVar22 == 4) {
                uVar25 = result.bigend.vect[1] >> 2;
                if (-1 < lVar24) {
                  uVar25 = (uint)result.bigend.vect[1] >> 2;
                }
              }
              else if (iVar22 == 2) {
                uVar25 = result.bigend.vect[1] >> 1;
                if (-1 < lVar24) {
                  uVar25 = (uint)result.bigend.vect[1] >> 1;
                }
              }
              else if (lVar24 < 0) {
                uVar25 = ~(~result.bigend.vect[1] / iVar22);
              }
              else {
                uVar25 = result.bigend.vect[1] / iVar22;
              }
            }
            uVar14 = result.bigend.vect[2];
            if (local_3c0 != 1) {
              if (local_3c0 == 4) {
                uVar14 = result.bigend.vect[2] >> 2;
                if (-1 < result.bigend.vect[2]) {
                  uVar14 = (uint)result.bigend.vect[2] >> 2;
                }
              }
              else if (local_3c0 == 2) {
                uVar14 = result.bigend.vect[2] >> 1;
                if (-1 < result.bigend.vect[2]) {
                  uVar14 = (uint)result.bigend.vect[2] >> 1;
                }
              }
              else if (result.bigend.vect[2] < 0) {
                uVar14 = ~(~result.bigend.vect[2] / local_3c0);
              }
              else {
                uVar14 = result.bigend.vect[2] / local_3c0;
              }
            }
            local_3bc = 0;
            result.bigend.vect[0] = uVar20;
            result.bigend.vect[1] = uVar25;
            result.bigend.vect[2] = uVar14;
          }
          else {
            local_36c.smallend.vect[0] = 0;
            local_36c.smallend.vect[1] = 0;
            local_36c.smallend.vect[2] = 0;
            for (lVar29 = 0; lVar29 != 3; lVar29 = lVar29 + 1) {
              if (((result.btype.itype >> ((uint)lVar29 & 0x1f) & 1) != 0) &&
                 (result.bigend.vect[lVar29] % local_324[lVar29] != 0)) {
                local_36c.smallend.vect[lVar29] = 1;
              }
            }
            uVar20 = result.bigend.vect[0];
            if (local_3cc != 1) {
              if (local_3cc == 4) {
                uVar20 = result.bigend.vect[0] >> 2;
                if (-1 < lVar16) {
                  uVar20 = (uint)result.bigend.vect[0] >> 2;
                }
              }
              else if (local_3cc == 2) {
                uVar20 = result.bigend.vect[0] >> 1;
                if (-1 < lVar16) {
                  uVar20 = (uint)result.bigend.vect[0] >> 1;
                }
              }
              else if (lVar16 < 0) {
                uVar20 = ~(~result.bigend.vect[0] / local_3cc);
              }
              else {
                uVar20 = result.bigend.vect[0] / local_3cc;
              }
            }
            uVar25 = result.bigend.vect[1];
            if (iVar22 != 1) {
              if (iVar22 == 4) {
                uVar25 = result.bigend.vect[1] >> 2;
                if (-1 < lVar24) {
                  uVar25 = (uint)result.bigend.vect[1] >> 2;
                }
              }
              else if (iVar22 == 2) {
                uVar25 = result.bigend.vect[1] >> 1;
                if (-1 < lVar24) {
                  uVar25 = (uint)result.bigend.vect[1] >> 1;
                }
              }
              else if (lVar24 < 0) {
                uVar25 = ~(~result.bigend.vect[1] / iVar22);
              }
              else {
                uVar25 = result.bigend.vect[1] / iVar22;
              }
            }
            local_3bc = result.btype.itype;
            uVar14 = result.bigend.vect[2];
            if (local_3c0 != 1) {
              if (local_3c0 == 4) {
                uVar14 = result.bigend.vect[2] >> 2;
                if (-1 < result.bigend.vect[2]) {
                  uVar14 = (uint)result.bigend.vect[2] >> 2;
                }
              }
              else if (local_3c0 == 2) {
                uVar14 = result.bigend.vect[2] >> 1;
                if (-1 < result.bigend.vect[2]) {
                  uVar14 = (uint)result.bigend.vect[2] >> 1;
                }
              }
              else if (result.bigend.vect[2] < 0) {
                uVar14 = ~(~result.bigend.vect[2] / local_3c0);
              }
              else {
                uVar14 = result.bigend.vect[2] / local_3c0;
              }
            }
            result.bigend.vect[0] = uVar20 + local_36c.smallend.vect[0];
            result.bigend.vect[1] = uVar25 + local_36c.smallend.vect[1];
            result.bigend.vect[2] = uVar14 + local_36c.smallend.vect[2];
          }
        }
        iVar12 = result.bigend.vect[2];
        iVar11 = result.bigend.vect[1];
        iVar10 = result.bigend.vect[0];
        iVar31 = result.smallend.vect[2];
        iVar4 = result.smallend.vect[1];
        amrex::MFIter::validbox(&local_36c,&mfi);
        iVar13 = local_36c.smallend.vect[2];
        iVar2 = local_36c.smallend.vect[0];
        if (local_36c.smallend.vect[0] < result.smallend.vect[0]) {
          iVar2 = result.smallend.vect[0];
        }
        iVar8 = local_36c.smallend.vect[1];
        if (local_36c.smallend.vect[1] < iVar4) {
          iVar8 = iVar4;
        }
        iVar4 = local_36c.smallend.vect[2];
        if (local_36c.smallend.vect[2] < iVar31) {
          iVar4 = iVar31;
        }
        iVar9 = local_36c.bigend.vect[0];
        if (iVar10 < local_36c.bigend.vect[0]) {
          iVar9 = iVar10;
        }
        iVar10 = local_36c.bigend.vect[1];
        if (iVar11 < local_36c.bigend.vect[1]) {
          iVar10 = iVar11;
        }
        iVar11 = local_36c.bigend.vect[2];
        if (iVar12 < local_36c.bigend.vect[2]) {
          iVar11 = iVar12;
        }
        if ((((iVar2 <= iVar9) && (iVar8 <= iVar10)) && (iVar4 <= iVar11)) && (local_3bc < 8)) {
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    ((Array4<double> *)&result,&phi_crse_strip.super_FabArray<amrex::FArrayBox>,&mfi
                    );
          lVar29 = (long)iVar8;
          if (iVar31 < iVar13) {
            iVar31 = iVar13;
          }
          lVar24 = (long)iVar31;
          lVar28 = CONCAT44(result.bigend.vect[2],result.bigend.vect[1]) * 8;
          lVar16 = CONCAT44(result.bigend.vect[0],result.smallend.vect[2]) * 8;
          puVar27 = (undefined8 *)
                    ((long)local_330 +
                    ((local_3c0 * lVar24 + local_338) * lVar18 * 8 +
                    local_340 * lVar29 + (long)iVar3 * -8) * lVar15 +
                    (long)iVar2 * (long)local_3cc * 8);
          lVar26 = (lVar29 - local_394) * lVar16 + (lVar24 - local_390) * lVar28 + (long)iVar2 * 8 +
                   (long)local_398 * -8 + CONCAT44(result.smallend.vect[1],result.smallend.vect[0]);
          for (; puVar30 = puVar27, lVar32 = lVar29, lVar34 = lVar26, lVar24 <= iVar11;
              lVar24 = lVar24 + 1) {
            for (; lVar32 <= iVar10; lVar32 = lVar32 + 1) {
              lVar19 = 0;
              puVar23 = puVar30;
              do {
                *(undefined8 *)(lVar34 + lVar19 * 8) = *puVar23;
                lVar19 = lVar19 + 1;
                puVar23 = puVar23 + local_3cc;
              } while ((iVar9 - iVar2) + 1 != (int)lVar19);
              puVar30 = (undefined8 *)((long)puVar30 + lVar35);
              lVar34 = lVar34 + lVar16;
            }
            lVar26 = lVar26 + lVar28;
            puVar27 = (undefined8 *)((long)puVar27 + (long)local_3c0 * 8 * lVar18 * lVar15);
          }
        }
        amrex::MFIter::operator++(&mfi);
      }
      amrex::MFIter::~MFIter(&mfi);
      this_00 = &(phi->super_vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>).
                 super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar33]->super_FabArray<amrex::FArrayBox>;
      period = amrex::Periodicity::NonPeriodic();
      amrex::FabArray<amrex::FArrayBox>::ParallelCopy
                (this_00,&phi_crse_strip.super_FabArray<amrex::FArrayBox>,period,COPY);
      amrex::MultiFab::~MultiFab((MultiFab *)&phi_crse_strip.super_FabArray<amrex::FArrayBox>);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&dm.m_ref.
                  super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      amrex::BoxArray::~BoxArray(&ba);
    }
  } while( true );
}

Assistant:

void
Projection::putDown (const Vector<MultiFab*>& phi,
                     FArrayBox*         phi_fine_strip,
                     int                c_lev,
                     int                f_lev,
                     const Orientation* outFaces,
                     int                numOutFlowFaces,
                     int                ncStripWidth)
{
    BL_PROFILE("Projection::putDown()");
    //
    // Put down to coarser levels.
    //
    const int nCompPhi = 1; // phi_fine_strip.nComp();
    const int nGrow    = 0; // phi_fine_strip.nGrow();
    IntVect ratio      = IntVect::TheUnitVector();

    for (int lev = f_lev-1; lev >= c_lev; lev--)
    {
        ratio *= parent->refRatio(lev);
        const Box& domainC = parent->Geom(lev).Domain();

        for (int iface = 0; iface < numOutFlowFaces; iface++)
        {
            Box phiC_strip =
                amrex::surroundingNodes(amrex::bdryNode(domainC, outFaces[iface], ncStripWidth));
            phiC_strip.grow(nGrow);
            BoxArray ba(phiC_strip);

            // FIXME: this size may need adjusting
            ba.maxSize(32);

            DistributionMapping dm{ba};
            MultiFab phi_crse_strip(ba, dm, nCompPhi, 0);
            phi_crse_strip.setVal(0);
            const auto& phi_f_arr = phi_fine_strip[iface].array();

#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            for (MFIter mfi(phi_crse_strip); mfi.isValid(); ++mfi)
            {
                Box ovlp = amrex::coarsen(phi_fine_strip[iface].box(),ratio) & mfi.validbox();
                if (ovlp.ok())
                {
                    const auto& phi_c_arr = phi_crse_strip.array(mfi);
                    ParallelFor(ovlp, [phi_c_arr,phi_f_arr,ratio]
                    AMREX_GPU_DEVICE (int i, int j, int k) noexcept
                    {
                       phi_c_arr(i,j,k) = phi_f_arr(i*ratio[0],j*ratio[1],k*ratio[2]);
                    });
                }
            }
            phi[lev]->ParallelCopy(phi_crse_strip);
        }
    }
}